

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.h
# Opt level: O2

void __thiscall Acceptor<Client>::Acceptor(Acceptor<Client> *this,int port)

{
  int iVar1;
  AcceptException *pAVar2;
  allocator<char> local_9d;
  int opt;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  (this->super_IAcceptor<Client>)._vptr_IAcceptor = (_func_int **)&PTR_accept_0010d9f8;
  opt = 1;
  this->addrlen = 0x10;
  iVar1 = socket(2,1,0);
  this->server_fd = iVar1;
  if (iVar1 == 0) {
    pAVar2 = (AcceptException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Socket create",&local_9d);
    AcceptException::AcceptException(pAVar2,&local_38);
    __cxa_throw(pAVar2,&AcceptException::typeinfo,AcceptException::~AcceptException);
  }
  iVar1 = setsockopt(iVar1,1,2,&opt,4);
  if (iVar1 != 0) {
    pAVar2 = (AcceptException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Set sock opt",&local_9d)
    ;
    AcceptException::AcceptException(pAVar2,&local_58);
    __cxa_throw(pAVar2,&AcceptException::typeinfo,AcceptException::~AcceptException);
  }
  (this->address).sin_family = 2;
  (this->address).sin_addr.s_addr = 0;
  (this->address).sin_port = (ushort)port << 8 | (ushort)port >> 8;
  iVar1 = bind(this->server_fd,(sockaddr *)&this->address,0x10);
  if (iVar1 < 0) {
    pAVar2 = (AcceptException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Bind failed",&local_9d);
    AcceptException::AcceptException(pAVar2,&local_78);
    __cxa_throw(pAVar2,&AcceptException::typeinfo,AcceptException::~AcceptException);
  }
  iVar1 = listen(this->server_fd,3);
  if (-1 < iVar1) {
    return;
  }
  pAVar2 = (AcceptException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Listen",&local_9d);
  AcceptException::AcceptException(pAVar2,&local_98);
  __cxa_throw(pAVar2,&AcceptException::typeinfo,AcceptException::~AcceptException);
}

Assistant:

Acceptor<T>::Acceptor(int port) {
    int opt = 1; 
    addrlen = sizeof(address); 
       
    if ((server_fd = socket(AF_INET, SOCK_STREAM, 0)) == 0) { 
        throw AcceptException("Socket create");
    } 
    if (setsockopt(server_fd, SOL_SOCKET, SO_REUSEADDR, 
                                                  &opt, sizeof(opt))) { 
        throw AcceptException("Set sock opt");
    } 

    address.sin_family = AF_INET; 
    address.sin_addr.s_addr = INADDR_ANY; 
    address.sin_port = htons(port);

    if (bind(server_fd, (struct sockaddr *)&address,  
                                 sizeof(address))<0) { 
        throw AcceptException("Bind failed");
    } 
    if (listen(server_fd, 3) < 0) { 
        throw AcceptException("Listen");
    }  
}